

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void show_floor(object **floor_list,wchar_t floor_num,wchar_t mode,item_tester tester)

{
  item_tester tester_local;
  wchar_t mode_local;
  wchar_t floor_num_local;
  object **floor_list_local;
  
  wipe_obj_list();
  tester_local._4_4_ = floor_num;
  if ((int)(uint)z_info->floor_size < floor_num) {
    tester_local._4_4_ = (wchar_t)z_info->floor_size;
  }
  build_obj_list(tester_local._4_4_ + L'\xffffffff',floor_list,tester,mode);
  num_head = L'\0';
  show_obj_list(mode);
  return;
}

Assistant:

void show_floor(struct object **floor_list, int floor_num, int mode,
				item_tester tester)
{
	/* Initialize */
	wipe_obj_list();

	if (floor_num > z_info->floor_size)
		floor_num = z_info->floor_size;

	/* Build the object list */
	build_obj_list(floor_num - 1, floor_list, tester, mode);

	/* Display the object list */
	num_head = 0;
	show_obj_list(mode);
}